

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O0

string * tinyusdz::io::GetBaseDir(string *__return_storage_ptr__,string *filepath)

{
  string *psVar1;
  long lVar2;
  allocator local_19;
  string *local_18;
  string *filepath_local;
  
  local_18 = filepath;
  filepath_local = __return_storage_ptr__;
  lVar2 = ::std::__cxx11::string::find_last_of((char *)filepath,0x9ea9cf);
  psVar1 = local_18;
  if (lVar2 == -1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    ::std::__cxx11::string::find_last_of((char *)local_18,0x9ea9cf);
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetBaseDir(const std::string &filepath) {
  if (filepath.find_last_of("/\\") != std::string::npos)
    return filepath.substr(0, filepath.find_last_of("/\\"));
  return "";
}